

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

void __thiscall MppDevServer::MppDevServer(MppDevServer *this)

{
  int iVar1;
  MPP_RET MVar2;
  MppServiceCmdCap *pMVar3;
  char *pcVar4;
  MppMemPool pvVar5;
  RK_S32 batch_task_size;
  MppDevServer *this_local;
  
  Mutex::Mutex(&this->super_Mutex);
  this->mServerError = (char *)0x0;
  this->mServerName = (char *)0x0;
  this->mInited = 0;
  this->mEnable = 1;
  this->mSessionPool = (MppMemPool)0x0;
  this->mBatchPool = (MppMemPool)0x0;
  this->mMaxTaskInBatch = 0;
  this->mCmdCap = (MppServiceCmdCap *)0x0;
  mpp_env_get_u32("mpp_server_debug",&mpp_server_debug,0);
  mpp_env_get_u32("mpp_server_enable",&this->mEnable,1);
  mpp_env_get_u32("mpp_server_batch_task",(RK_U32 *)&this->mMaxTaskInBatch,8);
  if (((this->mMaxTaskInBatch < 1) || (0x20 < this->mMaxTaskInBatch)) &&
     (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "mMaxTaskInBatch >= 1 && mMaxTaskInBatch <= 32","MppDevServer",0x252),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  iVar1 = this->mMaxTaskInBatch;
  pMVar3 = mpp_get_mpp_service_cmd_cap();
  this->mCmdCap = pMVar3;
  MVar2 = mpp_service_check_cmd_valid(0x204,this->mCmdCap);
  if (MVar2 == MPP_OK) {
    pcVar4 = mpp_get_mpp_service_name();
    this->mServerName = pcVar4;
    if (this->mServerName == (char *)0x0) {
      this->mServerError = "get service device failed";
    }
    else {
      pvVar5 = mpp_mem_pool_init_f("MppDevServer",0x1d8);
      this->mSessionPool = pvVar5;
      if (this->mSessionPool == (MppMemPool)0x0) {
        this->mServerError = "create session pool failed";
      }
      else {
        pvVar5 = mpp_mem_pool_init_f("MppDevServer",(long)(iVar1 * 0x1c0 + 0x60));
        this->mBatchPool = pvVar5;
        if (this->mBatchPool == (MppMemPool)0x0) {
          this->mServerError = "create batch tack pool failed";
        }
        else {
          this->mInited = 1;
        }
      }
    }
    if (this->mInited == 0) {
      clear(this);
    }
    else {
      memset(this->mBatServer,0,0xf0);
    }
  }
  else {
    this->mServerError = "mpp_service cmd not support";
  }
  return;
}

Assistant:

MppDevServer::MppDevServer() :
    mServerError(NULL),
    mServerName(NULL),
    mInited(0),
    mEnable(1),
    mSessionPool(NULL),
    mBatchPool(NULL),
    mMaxTaskInBatch(0),
    mCmdCap(NULL)
{
    RK_S32 batch_task_size = 0;

    mpp_env_get_u32("mpp_server_debug", &mpp_server_debug, 0);
    mpp_env_get_u32("mpp_server_enable", &mEnable, 1);
    mpp_env_get_u32("mpp_server_batch_task", (RK_U32 *)&mMaxTaskInBatch,
                    MAX_BATCH_TASK);

    mpp_assert(mMaxTaskInBatch >= 1 && mMaxTaskInBatch <= 32);
    batch_task_size = sizeof(MppDevBatTask) + mMaxTaskInBatch *
                      (sizeof(MppReqV1) * (MAX_REQ_SEND_CNT + MAX_REQ_WAIT_CNT) +
                       sizeof(MppDevBatCmd));

    mCmdCap = mpp_get_mpp_service_cmd_cap();
    if (MPP_OK != mpp_service_check_cmd_valid(MPP_CMD_SET_SESSION_FD, mCmdCap)) {
        mServerError = "mpp_service cmd not support";
        return;
    }

    do {
        mServerName = mpp_get_mpp_service_name();
        if (NULL == mServerName) {
            mServerError = "get service device failed";
            break;
        }

        mSessionPool = mpp_mem_pool_init(sizeof(MppDevSession));
        if (NULL == mSessionPool) {
            mServerError = "create session pool failed";
            break;
        }

        mBatchPool = mpp_mem_pool_init(batch_task_size);
        if (NULL == mBatchPool) {
            mServerError = "create batch tack pool failed";
            break;
        }

        mInited = 1;
    } while (0);

    if (!mInited) {
        clear();
        return;
    }

    memset(mBatServer, 0, sizeof(mBatServer));
}